

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Generators_Hammersley3D_Test::TestBody(Generators_Hammersley3D_Test *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  undefined1 extraout_var [56];
  undefined4 in_XMM2_Da;
  undefined1 in_register_00001284 [12];
  Point3f PVar13;
  AssertionResult gtest_ar;
  Hammersley3DIter __begin1;
  int count;
  Float invBase;
  float local_70;
  undefined4 uStack_6c;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  undefined8 local_50;
  float local_48;
  uint local_44;
  AssertHelper local_40;
  float local_38;
  float local_34;
  
  local_44 = 0;
  local_58.data_ = (AssertHelperData *)0x8000000000;
  local_34 = 0.5;
  local_38 = 0.33333334;
  auVar10 = ZEXT464(0x3eaaaaab);
  do {
    uVar2 = local_44;
    auVar12 = auVar10._8_56_;
    PVar13 = pbrt::detail::Hammersley3DIter::operator*((Hammersley3DIter *)&local_58);
    local_48 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar11._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar12;
    local_50 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               vmovlps_avx(auVar11._0_16_);
    local_70 = (float)(int)uVar2 * 0.0078125;
    testing::internal::CmpHelperEQ<float,float>
              (local_68,"(Float)count / 128.f","u[0]",&local_70,(float *)&local_50);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar7 = "";
      if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49a,pcVar7);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(uStack_6c,local_70) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)CONCAT44(uStack_6c,local_70) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(uStack_6c,local_70) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (uVar2 == 0) {
      auVar9 = ZEXT816(0) << 0x40;
    }
    else {
      fVar8 = 1.0;
      lVar6 = 0;
      uVar5 = (ulong)uVar2;
      do {
        fVar8 = local_34 * fVar8;
        lVar6 = (lVar6 - uVar5 / 2) * 2 + uVar5;
        bVar3 = 1 < uVar5;
        uVar5 = uVar5 / 2;
      } while (bVar3);
      auVar9._4_12_ = in_register_00001284;
      auVar9._0_4_ = in_XMM2_Da;
      auVar9 = vcvtusi2ss_avx512f(auVar9,lVar6);
      auVar9 = ZEXT416((uint)(fVar8 * auVar9._0_4_));
    }
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar9);
    local_70 = auVar9._0_4_;
    testing::internal::CmpHelperEQ<float,float>
              (local_68,"RadicalInverse(0, count)","u[1]",&local_70,(float *)((long)&local_50 + 4));
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar7 = "";
      if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49b,pcVar7);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(uStack_6c,local_70) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)CONCAT44(uStack_6c,local_70) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(uStack_6c,local_70) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (uVar2 == 0) {
      auVar9 = ZEXT816(0) << 0x40;
    }
    else {
      fVar8 = 1.0;
      lVar6 = 0;
      uVar5 = (ulong)uVar2;
      do {
        fVar8 = local_38 * fVar8;
        lVar6 = (lVar6 - uVar5 / 3) * 3 + uVar5;
        bVar3 = 2 < uVar5;
        uVar5 = uVar5 / 3;
      } while (bVar3);
      auVar1._4_12_ = in_register_00001284;
      auVar1._0_4_ = in_XMM2_Da;
      auVar9 = vcvtusi2ss_avx512f(auVar1,lVar6);
      auVar9 = ZEXT416((uint)(fVar8 * auVar9._0_4_));
    }
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar9);
    auVar10 = ZEXT1664(auVar9);
    local_70 = auVar9._0_4_;
    testing::internal::CmpHelperEQ<float,float>
              (local_68,"RadicalInverse(1, count)","u[2]",&local_70,&local_48);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar7 = "";
      if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49c,pcVar7);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(uStack_6c,local_70) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)CONCAT44(uStack_6c,local_70) != (long *)0x0)) {
          auVar10._0_8_ = (**(code **)(*(long *)CONCAT44(uStack_6c,local_70) + 8))();
          auVar10._8_56_ = extraout_var;
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_44 = uVar2 + 1;
    iVar4 = (int)local_58.data_ + 1;
    local_58.data_._0_4_ = iVar4;
  } while (iVar4 != 0x80);
  local_50._0_4_ = 0x80;
  testing::internal::CmpHelperEQ<int,int>(local_68,"128","count",(int *)&local_50,(int *)&local_44);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x49f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_50 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         )) {
        (**(code **)(*(long *)local_50 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Generators, Hammersley3D) {
    int count = 0;
    for (Point3f u : Hammersley3D(128)) {
        EXPECT_EQ((Float)count / 128.f, u[0]);
        EXPECT_EQ(RadicalInverse(0, count), u[1]);
        EXPECT_EQ(RadicalInverse(1, count), u[2]);
        ++count;
    }
    EXPECT_EQ(128, count);
}